

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkCompoundBin
          (FunctionReturnTypeEvaluator *this,BinExpr *expr)

{
  TreeOp TVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  TVar1 = (expr->super_Expr).super_Node._op;
  uVar4 = this->flags;
  this->flags = 0;
  checkExpr(this,expr->_lhs);
  uVar2 = this->flags;
  this->flags = 0;
  checkExpr(this,expr->_rhs);
  uVar3 = this->flags;
  if ((TVar1 == TO_NULLC) ||
     (((uVar3 & 8) == 0 || (uVar2 & 4) == 0 && ((uVar2 & 8) == 0 || (uVar3 & 4) == 0)))) {
    if ((uVar3 & 2) == 0) {
      if (((uVar3 | uVar2) & 0x10) == 0) {
        uVar4 = uVar4 | uVar3 & 0xfffffcfd;
      }
      else {
        uVar4 = uVar4 | 0x10;
      }
    }
    else {
      uVar4 = uVar4 | 2;
    }
  }
  else {
    uVar4 = uVar4 | 4;
  }
  this->flags = (uVar3 | uVar2) & 0x100 | uVar4;
  return;
}

Assistant:

void FunctionReturnTypeEvaluator::checkCompoundBin(const BinExpr *expr) {
  enum TreeOp op = expr->op();

  assert(op == TO_ANDAND || op == TO_OROR || op == TO_NULLC);

  unsigned old = flags;
  flags = 0;

  checkExpr(expr->lhs());

  unsigned lhsFlags = flags;
  flags = 0;

  checkExpr(expr->rhs());

  unsigned rhsFlags = flags;
  flags = old;

  lhsFlags &= ~RT_UNRECOGNIZED;
  rhsFlags &= ~RT_UNRECOGNIZED;

  bool hasFuncCall = (lhsFlags | rhsFlags) & RT_FUNCTION_CALL;

  lhsFlags &= ~RT_FUNCTION_CALL;
  rhsFlags &= ~RT_FUNCTION_CALL;

  if (op != TO_NULLC && (((lhsFlags & RT_BOOL) && (rhsFlags & RT_NUMBER)) || ((rhsFlags & RT_BOOL) && (lhsFlags & RT_NUMBER))))
    flags |= RT_BOOL;
  else if (rhsFlags & RT_NULL)
    flags |= RT_NULL;
  else if ((lhsFlags | rhsFlags) & RT_STRING)
    flags |= RT_STRING;
  else
    flags |= rhsFlags;

  if (hasFuncCall)
    flags |= RT_FUNCTION_CALL;
}